

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_invoke_helpers.hpp
# Opt level: O0

void asio_handler_invoke_helpers::
     invoke<asio::detail::binder0<asio::detail::binder1<asio::detail::iterator_connect_op<asio::ip::tcp,asio::any_io_executor,asio::ip::basic_resolver_iterator<asio::ip::tcp>,asio::detail::default_connect_condition,std::_Bind<void(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<nuraft::req_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,unsigned_long,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,unsigned_long,std::error_code,asio::ip::basic_resolver_iterator<asio::ip::tcp>)>>,std::error_code>>,asio::detail::binder0<asio::detail::binder1<asio::detail::iterator_connect_op<asio::ip::tcp,asio::any_io_executor,asio::ip::basic_resolver_iterator<asio::ip::tcp>,asio::detail::default_connect_condition,std::_Bind<void(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<nuraft::req_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,unsigned_long,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,unsigned_long,std::error_code,asio::ip::basic_resolver_iterator<asio::ip::tcp>)>>,std::error_code>>>
               (binder0<asio::detail::binder1<asio::detail::iterator_connect_op<asio::ip::tcp,_asio::any_io_executor,_asio::ip::basic_resolver_iterator<asio::ip::tcp>,_asio::detail::default_connect_condition,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_std::error_code,_asio::ip::basic_resolver_iterator<asio::ip::tcp>)>_>,_std::error_code>_>
                *function,
               binder0<asio::detail::binder1<asio::detail::iterator_connect_op<asio::ip::tcp,_asio::any_io_executor,_asio::ip::basic_resolver_iterator<asio::ip::tcp>,_asio::detail::default_connect_condition,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_std::error_code,_asio::ip::basic_resolver_iterator<asio::ip::tcp>)>_>,_std::error_code>_>
               *context)

{
  binder0<asio::detail::binder1<asio::detail::iterator_connect_op<asio::ip::tcp,_asio::any_io_executor,_asio::ip::basic_resolver_iterator<asio::ip::tcp>,_asio::detail::default_connect_condition,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_std::error_code,_asio::ip::basic_resolver_iterator<asio::ip::tcp>)>_>,_std::error_code>_>
  *in_RSI;
  binder0<asio::detail::binder1<asio::detail::iterator_connect_op<asio::ip::tcp,_asio::any_io_executor,_asio::ip::basic_resolver_iterator<asio::ip::tcp>,_asio::detail::default_connect_condition,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_std::error_code,_asio::ip::basic_resolver_iterator<asio::ip::tcp>)>_>,_std::error_code>_>
  *in_stack_ffffffffffffffe8;
  
  asio::detail::
  asio_handler_invoke<asio::detail::binder0<asio::detail::binder1<asio::detail::iterator_connect_op<asio::ip::tcp,asio::any_io_executor,asio::ip::basic_resolver_iterator<asio::ip::tcp>,asio::detail::default_connect_condition,std::_Bind<void(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<nuraft::req_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,unsigned_long,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,unsigned_long,std::error_code,asio::ip::basic_resolver_iterator<asio::ip::tcp>)>>,std::error_code>>,asio::detail::binder1<asio::detail::iterator_connect_op<asio::ip::tcp,asio::any_io_executor,asio::ip::basic_resolver_iterator<asio::ip::tcp>,asio::detail::default_connect_condition,std::_Bind<void(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<nuraft::req_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,unsigned_long,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,unsigned_long,std::error_code,asio::ip::basic_resolver_iterator<asio::ip::tcp>)>>,std::error_code>>
            (in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

inline void invoke(Function& function, Context& context)
{
#if !defined(ASIO_HAS_HANDLER_HOOKS)
  Function tmp(function);
  tmp();
#elif defined(ASIO_NO_DEPRECATED)
  // The asio_handler_invoke hook is no longer used to invoke the function.
  (void)&error_if_hook_is_defined<Function, Context>;
  (void)context;
  function();
#else
  using asio::asio_handler_invoke;
  asio_handler_invoke(function, asio::detail::addressof(context));
#endif
}